

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_diag_sse41_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  parasail_result_t *ppVar6;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  ulong uVar7;
  int64_t *piVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int64_t iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  long lVar27;
  __m128i_64_t B;
  long lVar33;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  __m128i_64_t B_2;
  undefined1 auVar36 [16];
  ulong uVar37;
  __m128i_64_t B_4;
  long lVar39;
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  __m128i_64_t B_3;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM13 [16];
  undefined4 uVar45;
  undefined4 uVar46;
  long lVar47;
  __m128i_64_t B_1;
  long lVar50;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  __m128i vMaxH;
  ulong uStack_100;
  undefined1 local_f8 [16];
  int64_t *local_e0;
  long local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  char *local_98;
  long lStack_90;
  undefined1 local_88 [16];
  long local_70;
  ulong local_68;
  long local_60;
  int *local_58;
  ulong local_50;
  ulong local_48;
  undefined8 uStack_40;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_table_diag_sse41_128_64_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_table_diag_sse41_128_64_cold_6();
  }
  else if (open < 0) {
    parasail_sw_table_diag_sse41_128_64_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_table_diag_sse41_128_64_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_table_diag_sse41_128_64_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_table_diag_sse41_128_64_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_sw_table_diag_sse41_128_64_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      _s1Len = matrix->length;
    }
    iVar5 = matrix->min;
    uVar7 = 0x8000000000000000 - (long)iVar5;
    if (iVar5 != -open && SBORROW4(iVar5,-open) == iVar5 + open < 0) {
      uVar7 = (ulong)(uint)open | 0x8000000000000000;
    }
    lVar22 = uVar7 + 1;
    iVar5 = matrix->max;
    auVar24._8_4_ = (int)lVar22;
    auVar24._0_8_ = lVar22;
    auVar24._12_4_ = (int)((ulong)lVar22 >> 0x20);
    local_f8 = auVar24;
    local_c8 = auVar24;
    local_98 = _s1;
    local_88 = auVar24;
    ppVar6 = parasail_result_new_table1(_s1Len,s2Len);
    if (ppVar6 != (parasail_result_t *)0x0) {
      local_b8._0_4_ = gap;
      ppVar6->flag = ppVar6->flag | 0x2821004;
      uVar10 = (ulong)(s2Len + 2);
      local_a8 = (ulong)(uint)open;
      local_68 = uVar7;
      ptr = parasail_memalign_int64_t(0x10,uVar10);
      ptr_00 = parasail_memalign_int64_t(0x10,uVar10);
      ptr_01 = parasail_memalign_int64_t(0x10,uVar10);
      if (ptr_01 != (int64_t *)0x0 && (ptr_00 != (int64_t *)0x0 && ptr != (int64_t *)0x0)) {
        uVar7 = (ulong)_s1Len;
        if (matrix->type == 0) {
          local_e0 = parasail_memalign_int64_t(0x10,(long)(_s1Len + 1));
          if (local_e0 == (int64_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < _s1Len) {
            piVar1 = matrix->mapper;
            uVar10 = 0;
            do {
              local_e0[uVar10] = (long)piVar1[(byte)local_98[uVar10]];
              uVar10 = uVar10 + 1;
            } while (uVar7 != uVar10);
          }
          local_e0[uVar7] = 0;
        }
        else {
          local_e0 = (int64_t *)0x0;
        }
        uVar10 = local_a8;
        local_70 = 0x7ffffffffffffffe - (long)iVar5;
        auVar34._8_4_ = (int)local_70;
        auVar34._0_8_ = local_70;
        auVar34._12_4_ = (int)((ulong)local_70 >> 0x20);
        uStack_100 = auVar24._8_8_;
        local_48 = uStack_100;
        uStack_40 = 0;
        uStack_a0 = (undefined4)local_a8;
        uStack_9c = local_a8._4_4_;
        local_b8._0_8_ = CONCAT44(0,local_b8._0_4_);
        local_b8._8_4_ = local_b8._0_4_;
        local_b8._12_4_ = 0;
        auVar4 = local_b8;
        uVar23 = (ulong)(uint)s2Len;
        piVar1 = matrix->mapper;
        uVar11 = 1;
        if (1 < s2Len) {
          uVar11 = (ulong)(uint)s2Len;
        }
        uVar18 = 0;
        do {
          ptr[uVar18 + 1] = (long)piVar1[(byte)_s2[uVar18]];
          uVar18 = uVar18 + 1;
        } while (uVar11 != uVar18);
        uVar18 = 0;
        *ptr = 0;
        ptr[uVar23 + 1] = 0;
        do {
          ptr_00[uVar18 + 1] = 0;
          ptr_01[uVar18 + 1] = lVar22;
          uVar18 = uVar18 + 1;
        } while (uVar11 != uVar18);
        *ptr_00 = lVar22;
        *ptr_01 = lVar22;
        ptr_00[uVar23 + 1] = lVar22;
        ptr_01[uVar23 + 1] = lVar22;
        lVar17 = lVar22;
        uVar11 = uStack_100;
        if (0 < _s1Len) {
          local_58 = matrix->matrix;
          local_60 = uVar23 * 8;
          local_d0 = uVar23 * 4 + -4;
          auVar41 = pmovsxbq(in_XMM8,1);
          local_d8 = 0;
          auVar43._8_4_ = 0xffffffff;
          auVar43._0_8_ = 0xffffffffffffffff;
          auVar43._12_4_ = 0xffffffff;
          uVar18 = 0;
          piVar8 = local_e0;
          do {
            uVar12 = uVar18;
            if (matrix->type == 0) {
              uVar12 = piVar8[uVar18];
            }
            local_50 = uVar18;
            uVar21 = uVar18 | 1;
            if (matrix->type == 0) {
              iVar15 = piVar8[uVar21];
            }
            else {
              uVar14 = _s1Len - 1;
              if (uVar21 < uVar7) {
                uVar14 = (uint)uVar18 | 1;
              }
              iVar15 = (int64_t)(int)uVar14;
            }
            iVar5 = matrix->size;
            local_98 = (char *)-(ulong)(auVar41._0_8_ < (long)uVar7);
            lVar16 = auVar41._8_8_;
            lStack_90 = -(ulong)(lVar16 < (long)uVar7);
            uVar13 = 0;
            in_XMM13 = pmovsxbq(in_XMM13,0xff);
            auVar38._8_8_ = 0;
            auVar38._0_8_ = uStack_100;
            auVar36 = auVar38;
            auVar42 = auVar24;
            auVar49 = auVar24;
            do {
              lVar2 = auVar36._8_8_;
              uVar45 = (undefined4)ptr_00[uVar13 + 1];
              uVar46 = (undefined4)((ulong)ptr_00[uVar13 + 1] >> 0x20);
              auVar40._8_4_ = uVar45;
              auVar40._0_8_ = lVar2;
              auVar40._12_4_ = uVar46;
              lVar39 = auVar40._8_8_ - uVar10;
              local_b8._12_4_ = 0;
              lVar27 = auVar42._8_8_ - local_b8._0_8_;
              if (lVar27 < (long)(lVar2 - uVar10)) {
                lVar27 = lVar2 - uVar10;
              }
              lVar20 = ptr_01[uVar13 + 1] - local_b8._8_8_;
              if (ptr_01[uVar13 + 1] - local_b8._8_8_ < lVar39) {
                lVar20 = lVar39;
              }
              lVar39 = auVar36._0_8_ - uVar10;
              lVar47 = auVar49._0_8_ - local_b8._0_8_;
              lVar50 = auVar49._8_8_ - local_b8._8_8_;
              if (lVar39 <= lVar47) {
                lVar39 = lVar47;
              }
              lVar47 = lVar2 - uVar10;
              if ((long)(lVar2 - uVar10) <= lVar50) {
                lVar47 = lVar50;
              }
              lVar50 = (long)local_58[iVar15 * iVar5 + ptr[uVar13]] + auVar38._0_8_;
              lVar33 = (long)local_58[uVar12 * (long)iVar5 + ptr[uVar13 + 1]] + auVar38._8_8_;
              if (lVar50 <= lVar39) {
                lVar50 = lVar39;
              }
              if (lVar33 <= lVar47) {
                lVar33 = lVar47;
              }
              if (lVar50 <= lVar27) {
                lVar50 = lVar27;
              }
              if (lVar33 <= lVar20) {
                lVar33 = lVar20;
              }
              if (lVar50 < 1) {
                lVar50 = 0;
              }
              if (lVar33 < 1) {
                lVar33 = 0;
              }
              auVar42._8_8_ = lVar20;
              auVar42._0_8_ = lVar27;
              auVar48._8_8_ = lVar47;
              auVar48._0_8_ = lVar39;
              auVar36._8_8_ = lVar33;
              auVar36._0_8_ = lVar50;
              lVar39 = in_XMM13._0_8_;
              lVar20 = in_XMM13._8_8_;
              auVar49._0_8_ = -(ulong)(lVar39 == auVar43._0_8_);
              auVar49._8_8_ = -(ulong)(lVar20 == auVar43._8_8_);
              auVar36 = ~auVar49 & auVar36;
              auVar42 = blendvpd(auVar42,auVar24,auVar49);
              auVar49 = blendvpd(auVar48,auVar24,auVar49);
              uVar37 = auVar36._8_8_;
              lVar27 = auVar36._0_8_;
              if (1 < uVar13) {
                lVar47 = auVar34._0_8_;
                if (lVar27 <= auVar34._0_8_) {
                  lVar47 = lVar27;
                }
                uVar19 = auVar34._8_8_;
                if ((long)uVar37 <= (long)auVar34._8_8_) {
                  uVar19 = uVar37;
                }
                if (lVar17 <= lVar27) {
                  lVar17 = lVar27;
                }
                if ((long)uVar11 <= (long)uVar37) {
                  uVar11 = uVar37;
                }
                auVar34._8_8_ = uVar19;
                auVar34._0_8_ = lVar47;
              }
              piVar1 = ((ppVar6->field_4).rowcols)->score_row;
              if (uVar13 < uVar23) {
                *(int *)((long)piVar1 + uVar13 * 4 + local_d8) = auVar36._8_4_;
              }
              if (uVar13 != 0 && uVar21 < uVar7) {
                *(int *)((long)piVar1 + uVar13 * 4 + local_d0) = auVar36._0_4_;
              }
              ptr_00[uVar13] = lVar27;
              ptr_01[uVar13] = auVar42._0_8_;
              auVar28._0_8_ = -(ulong)(SUB168(in_XMM13 ^ auVar43,0) < 0);
              auVar28._8_8_ = -(ulong)(SUB168(in_XMM13 ^ auVar43,8) < 0);
              auVar3._8_8_ = lStack_90;
              auVar3._0_8_ = local_98;
              auVar44._8_8_ = -(ulong)(lVar20 < (long)uVar23);
              auVar44._0_8_ = -(ulong)(lVar39 < (long)uVar23);
              auVar44 = auVar44 & auVar28 & auVar3;
              auVar31._0_8_ = -(ulong)(lVar27 == local_88._0_8_);
              auVar31._8_8_ = -(ulong)(uVar37 == local_88._8_8_);
              auVar25._0_8_ = -(ulong)(local_88._0_8_ < lVar27);
              auVar25._8_8_ = -(ulong)((long)local_88._8_8_ < (long)uVar37);
              uVar14 = movmskpd((int)-(ulong)(lVar20 < (long)uVar23),auVar25);
              auVar26._8_8_ = -(ulong)(byte)((byte)uVar14 >> 1);
              auVar26._0_8_ = -(ulong)(uVar14 & 1);
              auVar26 = auVar26 & auVar44;
              auVar29._0_8_ = -(ulong)(lVar39 < local_c8._0_8_);
              auVar29._8_8_ = -(ulong)(lVar20 < local_c8._8_8_);
              uVar14 = movmskpd((int)-(ulong)(uVar14 & 1),auVar29);
              auVar30._8_8_ = -(ulong)(byte)((byte)uVar14 >> 1);
              auVar30._0_8_ = -(ulong)(uVar14 & 1);
              local_88 = pblendvb(local_88,auVar36,auVar26);
              auVar43._8_4_ = 0xffffffff;
              auVar43._0_8_ = 0xffffffffffffffff;
              auVar43._12_4_ = 0xffffffff;
              auVar40 = pblendvb(local_f8,auVar41,auVar26);
              auVar38 = pblendvb(local_c8,in_XMM13,auVar26);
              auVar31 = auVar30 & auVar44 & auVar31;
              local_f8 = pblendvb(auVar40,auVar41,auVar31);
              local_c8 = pblendvb(auVar38,in_XMM13,auVar31);
              in_XMM13._0_8_ = lVar39 + 1;
              in_XMM13._8_8_ = lVar20 - auVar43._8_8_;
              uVar13 = uVar13 + 1;
              auVar38._8_4_ = uVar45;
              auVar38._0_8_ = lVar2;
              auVar38._12_4_ = uVar46;
            } while (s2Len + 1 != uVar13);
            auVar41._0_8_ = auVar41._0_8_ + 2;
            auVar41._8_8_ = lVar16 + 2;
            uVar18 = uVar18 + 2;
            local_d8 = local_d8 + local_60;
            local_d0 = local_d0 + local_60;
            piVar8 = local_e0;
          } while (uVar18 < uVar7);
        }
        lVar16 = 0;
        iVar5 = 0;
        iVar9 = 0;
        do {
          lVar2 = *(long *)(local_88 + lVar16 * 8);
          if (lVar22 < lVar2) {
            iVar5 = *(int *)(local_f8 + lVar16 * 8);
            lVar22 = lVar2;
            iVar9 = *(int *)(local_c8 + lVar16 * 8);
          }
          else if (lVar2 == lVar22) {
            lVar2 = *(long *)(local_c8 + lVar16 * 8);
            if (lVar2 < iVar9) {
              iVar5 = *(int *)(local_f8 + lVar16 * 8);
              iVar9 = (int)lVar2;
            }
            else if ((lVar2 == iVar9) && (*(long *)(local_f8 + lVar16 * 8) < (long)iVar5)) {
              iVar5 = (int)*(long *)(local_f8 + lVar16 * 8);
              iVar9 = (int)lVar2;
            }
          }
          lVar16 = lVar16 + 1;
        } while ((int)lVar16 == 1);
        auVar32._8_8_ = -(ulong)(auVar34._8_8_ <= (long)local_68);
        auVar32._0_8_ = -(ulong)(auVar34._0_8_ <= (long)local_68);
        auVar35._8_8_ = -(ulong)(local_70 < (long)uVar11);
        auVar35._0_8_ = -(ulong)(local_70 < lVar17);
        auVar35 = auVar35 | auVar32;
        if ((((((((((((((((auVar35 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar35 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar35 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar35 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar35 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar35 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar35 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar35 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar35 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar35 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar35 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar35 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar35[0xf] < '\0') {
          *(byte *)&ppVar6->flag = (byte)ppVar6->flag | 0x40;
          lVar22 = 0;
          iVar9 = 0;
          iVar5 = 0;
        }
        ppVar6->score = (int)lVar22;
        ppVar6->end_query = iVar5;
        ppVar6->end_ref = iVar9;
        local_b8 = auVar4;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(local_e0);
          return ppVar6;
        }
        return ppVar6;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vNH, vOpen),
                    _mm_sub_epi64(vF, vGap));
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vWH, vOpen),
                    _mm_sub_epi64(vE, vGap));
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            vWH = _mm_max_epi64_rpl(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi64_rpl(vJ, vNegOne),
                        _mm_cmplt_epi64_rpl(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi64(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}